

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O0

Mesh * __thiscall SceneParser::parseTriangleMesh(SceneParser *this)

{
  int iVar1;
  size_t sVar2;
  Mesh *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [40];
  Mesh *answer;
  char *ext;
  char filename [100];
  char local_78 [8];
  char token [100];
  SceneParser *this_local;
  
  unique0x10000255 = this;
  getToken(this,local_78);
  iVar1 = strcmp(local_78,"{");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x1a4,"Mesh *SceneParser::parseTriangleMesh()");
  }
  getToken(this,local_78);
  iVar1 = strcmp(local_78,"obj_file");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"obj_file\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x1a6,"Mesh *SceneParser::parseTriangleMesh()");
  }
  getToken(this,(char *)&ext);
  getToken(this,local_78);
  iVar1 = strcmp(local_78,"}");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"}\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x1a9,"Mesh *SceneParser::parseTriangleMesh()");
  }
  sVar2 = strlen((char *)&ext);
  answer = (Mesh *)((long)&answer + sVar2 + 4);
  iVar1 = strcmp((char *)answer,".obj");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(ext, \".obj\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x1ab,"Mesh *SceneParser::parseTriangleMesh()");
  }
  this_00 = (Mesh *)operator_new(0xe8);
  std::operator+(local_118,(char *)&this->_basepath);
  Mesh::Mesh(this_00,local_118,this->_current_material);
  std::__cxx11::string::~string((string *)local_118);
  return this_00;
}

Assistant:

Mesh *
SceneParser::parseTriangleMesh() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    char filename[MAX_PARSER_TOKEN_LENGTH];
    // get the filename
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "obj_file"));
    getToken(filename);
    getToken(token);
    assert(!strcmp(token, "}"));
    const char *ext = &filename[strlen(filename) - 4];
    assert(!strcmp(ext, ".obj"));
    Mesh *answer = new Mesh(_basepath + filename, _current_material);

    return answer;
}